

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O3

void __thiscall
btCapsuleShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btCapsuleShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  undefined8 uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  float extraout_XMM0_Da;
  float fVar6;
  float extraout_XMM0_Da_00;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btScalar local_88 [2];
  undefined8 uStack_80;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  btScalar local_58;
  btScalar bStack_54;
  btScalar bStack_50;
  btScalar bStack_4c;
  undefined1 local_48 [16];
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  if (0 < numVectors) {
    local_58 = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats
               [(*(int *)&(this->super_btConvexInternalShape).field_0x44 + 2) % 3];
    local_48 = ZEXT416((uint)local_58);
    lVar5 = 0;
    bStack_54 = local_58;
    bStack_50 = local_58;
    bStack_4c = local_58;
    do {
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      uStack_80 = 0;
      iVar2 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
      local_88[iVar2] =
           (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar2];
      local_78 = ZEXT416((uint)(*(float *)((long)vectors->m_floats + lVar5 + 8) *
                                (float)local_48._0_4_ + (float)uStack_80));
      uVar1 = *(undefined8 *)((long)vectors->m_floats + lVar5);
      local_68 = local_88[0] + (float)uVar1 * local_58;
      fStack_64 = local_88[1] + (float)((ulong)uVar1 >> 0x20) * bStack_54;
      fStack_60 = bStack_50 * 0.0 + 0.0;
      fStack_5c = bStack_4c * 0.0 + 0.0;
      (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xc])(this);
      uVar1 = *(undefined8 *)((long)vectors->m_floats + lVar5);
      local_38 = (float)uVar1;
      fStack_34 = (float)((ulong)uVar1 >> 0x20);
      fVar10 = local_68 - extraout_XMM0_Da * local_38;
      fVar11 = fStack_64 - extraout_XMM0_Da * fStack_34;
      fVar7 = *(float *)((long)vectors->m_floats + lVar5 + 8);
      fVar8 = (float)local_78._0_4_ - extraout_XMM0_Da * fVar7;
      fVar6 = fVar7 * fVar8 + local_38 * fVar10 + fStack_34 * fVar11;
      local_68 = -1e+18;
      if (-1e+18 < fVar6) {
        auVar4._4_4_ = fVar11;
        auVar4._0_4_ = fVar10;
        auVar4._8_4_ = fVar8;
        auVar4._12_4_ = 0;
        *(undefined1 (*) [16])((long)supportVerticesOut->m_floats + lVar5) = auVar4;
        uVar1 = *(undefined8 *)((long)vectors->m_floats + lVar5);
        local_38 = (float)uVar1;
        fStack_34 = (float)((ulong)uVar1 >> 0x20);
        fVar7 = *(float *)((long)vectors->m_floats + lVar5 + 8);
        local_68 = fVar6;
      }
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      uStack_80 = 0;
      iVar2 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
      local_88[iVar2] =
           -(this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar2];
      local_38 = local_38 * local_58;
      fStack_34 = fStack_34 * bStack_54;
      fStack_30 = bStack_50 * 0.0;
      fStack_2c = bStack_4c * 0.0;
      local_78 = ZEXT416((uint)(fVar7 * (float)local_48._0_4_ + (float)uStack_80));
      (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xc])(this);
      fVar7 = *(float *)((long)vectors->m_floats + lVar5 + 8);
      uVar1 = *(undefined8 *)((long)vectors->m_floats + lVar5);
      fVar11 = (float)uVar1;
      fVar9 = (float)((ulong)uVar1 >> 0x20);
      fVar8 = (local_88[0] + local_38) - extraout_XMM0_Da_00 * fVar11;
      fVar10 = (local_88[1] + fStack_34) - extraout_XMM0_Da_00 * fVar9;
      fVar6 = (float)local_78._0_4_ - extraout_XMM0_Da_00 * fVar7;
      if (local_68 < fVar7 * fVar6 + fVar11 * fVar8 + fVar9 * fVar10) {
        auVar3._4_4_ = fVar10;
        auVar3._0_4_ = fVar8;
        auVar3._8_4_ = fVar6;
        auVar3._12_4_ = 0;
        *(undefined1 (*) [16])((long)supportVerticesOut->m_floats + lVar5) = auVar3;
      }
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)numVectors << 4 != lVar5);
  }
  return;
}

Assistant:

void	btCapsuleShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{

	
	btScalar radius = getRadius();

	for (int j=0;j<numVectors;j++)
	{
		btScalar maxDot(btScalar(-BT_LARGE_FLOAT));
		const btVector3& vec = vectors[j];

		btVector3 vtx;
		btScalar newDot;
		{
			btVector3 pos(0,0,0);
			pos[getUpAxis()] = getHalfHeight();
			vtx = pos +vec*(radius) - vec * getMargin();
			newDot = vec.dot(vtx);
			if (newDot > maxDot)
			{
				maxDot = newDot;
				supportVerticesOut[j] = vtx;
			}
		}
		{
			btVector3 pos(0,0,0);
			pos[getUpAxis()] = -getHalfHeight();
			vtx = pos +vec*(radius) - vec * getMargin();
			newDot = vec.dot(vtx);
			if (newDot > maxDot)
			{
				maxDot = newDot;
				supportVerticesOut[j] = vtx;
			}
		}
		
	}
}